

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  ImVector<ImDrawVert> *this;
  ImDrawList *this_00;
  ulong uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ImGuiWindow *pIVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ImDrawCmd *pIVar17;
  ImDrawVert *pIVar18;
  char *pcVar19;
  uint i;
  ulong uVar20;
  uint uVar21;
  uint i_00;
  unsigned_short *puVar22;
  ImGuiContext *g;
  char *pcVar23;
  int n;
  ImDrawCmd *pIVar24;
  long lVar25;
  float fVar26;
  ImGuiListClipper clipper;
  ulong local_1e0;
  ImVec2 local_1c0;
  ImVec2 triangle_2 [3];
  float local_188;
  float fStack_184;
  float local_178;
  float fStack_174;
  char buf [300];
  undefined1 local_3c [12];
  
  pcVar23 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar23 = draw_list->_OwnerName;
  }
  bVar12 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar23,
                    (ulong)(uint)(draw_list->VtxBuffer).Size,
                    (ulong)(uint)(draw_list->IdxBuffer).Size,(draw_list->CmdBuffer).Size);
  pIVar11 = GImGui;
  pIVar10 = GImGui->CurrentWindow;
  pIVar10->WriteAccessed = true;
  if (pIVar10->DrawList == draw_list) {
    SameLine(0.0,-1.0);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = -0x80;
    buf[3] = '?';
    buf[4] = -0x33;
    buf[5] = -0x34;
    buf[6] = -0x34;
    buf[7] = '>';
    buf[8] = -0x33;
    buf[9] = -0x34;
    buf[10] = -0x34;
    buf[0xb] = '>';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = -0x80;
    buf[0xf] = '?';
    TextColored((ImVec4 *)buf,"CURRENTLY APPENDING");
    if (!bVar12) {
      return;
    }
  }
  else {
    this_00 = &pIVar11->ForegroundDrawList;
    if (window == (ImGuiWindow *)0x0) {
      if (!bVar12) {
        return;
      }
    }
    else {
      bVar13 = IsItemHovered(0);
      if (bVar13) {
        buf._0_4_ = (window->Size).x + (window->Pos).x;
        buf._4_4_ = (window->Size).y + (window->Pos).y;
        ImDrawList::AddRect(this_00,&window->Pos,(ImVec2 *)buf,0xff00ffff,0.0,0xf,1.0);
      }
      if (!bVar12) {
        return;
      }
      if (window->WasActive == false) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
    }
    this = &draw_list->VtxBuffer;
    pIVar17 = (draw_list->CmdBuffer).Data;
    local_1e0 = 0;
    for (pIVar24 = pIVar17; pIVar24 < pIVar17 + (draw_list->CmdBuffer).Size; pIVar24 = pIVar24 + 1)
    {
      iVar14 = (int)local_1e0;
      if (pIVar24->UserCallback == (ImDrawCallback)0x0) {
        if (pIVar24->ElemCount != 0) {
          if ((draw_list->IdxBuffer).Size < 1) {
            puVar22 = (unsigned_short *)0x0;
          }
          else {
            puVar22 = (draw_list->IdxBuffer).Data;
          }
          ImFormatString(buf,300,
                         "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         SUB84((double)(pIVar24->ClipRect).x,0),(double)(pIVar24->ClipRect).y,
                         (double)(pIVar24->ClipRect).z,(double)(pIVar24->ClipRect).w,
                         (ulong)pIVar24->ElemCount / 3,pIVar24->TextureId);
          bVar12 = TreeNode((void *)(((long)pIVar24 - (long)(draw_list->CmdBuffer).Data) / 0x38),
                            "%s",buf);
          if ((show_drawcmd_details == true) && (bVar13 = IsItemHovered(0), bVar13)) {
            uVar2 = (pIVar24->ClipRect).x;
            uVar6 = (pIVar24->ClipRect).y;
            uVar3 = (pIVar24->ClipRect).z;
            uVar7 = (pIVar24->ClipRect).w;
            clipper.DisplayStart = 0x7f7fffff;
            clipper.DisplayEnd = 0x7f7fffff;
            clipper.ItemsCount = -0x800001;
            clipper.StepNo = -0x800001;
            for (uVar20 = local_1e0; uVar20 < pIVar24->ElemCount + iVar14; uVar20 = uVar20 + 1) {
              if (puVar22 == (unsigned_short *)0x0) {
                uVar21 = (uint)uVar20;
              }
              else {
                uVar21 = (uint)puVar22[uVar20];
              }
              pIVar18 = ImVector<ImDrawVert>::operator[](this,uVar21);
              ImRect::Add((ImRect *)&clipper,&pIVar18->pos);
            }
            triangle_2[0].y = (float)(int)(float)uVar6;
            triangle_2[0].x = (float)(int)(float)uVar2;
            local_1c0.y = (float)(int)(float)uVar7;
            local_1c0.x = (float)(int)(float)uVar3;
            ImDrawList::AddRect(this_00,triangle_2,&local_1c0,0xffff00ff,0.0,0xf,1.0);
            triangle_2[0].y = (float)(int)clipper.DisplayEnd;
            triangle_2[0].x = (float)(int)clipper.DisplayStart;
            local_1c0.y = (float)(int)(float)clipper.StepNo;
            local_1c0.x = (float)(int)(float)clipper.ItemsCount;
            ImDrawList::AddRect(this_00,triangle_2,&local_1c0,0xff00ffff,0.0,0xf,1.0);
          }
          if (bVar12) {
            fVar26 = 0.0;
            for (uVar20 = local_1e0; (uint)uVar20 < iVar14 + pIVar24->ElemCount; uVar20 = uVar20 + 3
                ) {
              clipper.DisplayStart = 0;
              clipper.DisplayEnd = 0;
              clipper.ItemsCount = 0;
              clipper.StepNo = 0;
              clipper.ItemsHeight = 0.0;
              clipper.StartPosY = 0.0;
              for (lVar25 = 0; lVar25 != 3; lVar25 = lVar25 + 1) {
                uVar21 = (uint)(uVar20 + lVar25);
                if (puVar22 != (unsigned_short *)0x0) {
                  uVar21 = (uint)puVar22[uVar20 + lVar25 & 0xffffffff];
                }
                pIVar18 = ImVector<ImDrawVert>::operator[](this,uVar21);
                *(ImVec2 *)(&clipper.DisplayStart + lVar25 * 2) = pIVar18->pos;
              }
              fVar26 = fVar26 + ABS(((float)clipper.DisplayEnd - (float)clipper.StepNo) *
                                    clipper.ItemsHeight +
                                    ((float)clipper.StepNo - clipper.StartPosY) *
                                    (float)clipper.DisplayStart +
                                    (clipper.StartPosY - (float)clipper.DisplayEnd) *
                                    (float)clipper.ItemsCount) * 0.5;
            }
            ImFormatString(buf,300,
                           "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                           SUB84((double)fVar26,0),(ulong)pIVar24->ElemCount,
                           (ulong)pIVar24->VtxOffset,(ulong)pIVar24->IdxOffset);
            clipper.DisplayStart = 0;
            clipper.DisplayEnd = 0;
            Selectable(buf,false,0,(ImVec2 *)&clipper);
            bVar12 = IsItemHovered(0);
            if ((bVar12) && (show_drawcmd_details == true)) {
              uVar21 = (pIVar11->ForegroundDrawList).Flags;
              (pIVar11->ForegroundDrawList).Flags = uVar21 & 0xfffffffe;
              uVar4 = (pIVar24->ClipRect).x;
              uVar8 = (pIVar24->ClipRect).y;
              clipper.DisplayEnd = (int)(float)(int)(float)uVar8;
              clipper.DisplayStart = (int)(float)(int)(float)uVar4;
              uVar5 = (pIVar24->ClipRect).z;
              uVar9 = (pIVar24->ClipRect).w;
              triangle_2[0].y = (float)(int)(float)uVar9;
              triangle_2[0].x = (float)(int)(float)uVar5;
              ImDrawList::AddRect(this_00,(ImVec2 *)&clipper,triangle_2,0xffff00ff,0.0,0xf,1.0);
              for (; (uint)local_1e0 < pIVar24->ElemCount + iVar14; local_1e0 = local_1e0 + 3) {
                clipper.DisplayStart = 0;
                clipper.DisplayEnd = 0;
                clipper.ItemsCount = 0;
                clipper.StepNo = 0;
                clipper.ItemsHeight = 0.0;
                clipper.StartPosY = 0.0;
                for (lVar25 = 0; lVar25 != 3; lVar25 = lVar25 + 1) {
                  i_00 = (uint)(local_1e0 + lVar25);
                  if (puVar22 != (unsigned_short *)0x0) {
                    i_00 = (uint)puVar22[local_1e0 + lVar25 & 0xffffffff];
                  }
                  pIVar18 = ImVector<ImDrawVert>::operator[](this,i_00);
                  *(ImVec2 *)(&clipper.DisplayStart + lVar25 * 2) = pIVar18->pos;
                }
                ImDrawList::AddPolyline(this_00,(ImVec2 *)&clipper,3,0xff00ffff,true,1.0);
              }
              (pIVar11->ForegroundDrawList).Flags = uVar21;
            }
            clipper.ItemsCount = pIVar24->ElemCount / 3;
            clipper.StartPosY = (GImGui->CurrentWindow->DC).CursorPos.y;
            clipper.StepNo = 0;
            clipper.ItemsHeight = -1.0;
            clipper.DisplayStart = -1;
            clipper.DisplayEnd = -1;
            while (bVar12 = ImGuiListClipper::Step(&clipper), bVar12) {
              uVar20 = (ulong)(uint)(clipper.DisplayStart * 3 + iVar14);
              for (iVar16 = clipper.DisplayStart; iVar16 < clipper.DisplayEnd; iVar16 = iVar16 + 1)
              {
                triangle_2[0].x = 0.0;
                triangle_2[0].y = 0.0;
                triangle_2[1].x = 0.0;
                triangle_2[1].y = 0.0;
                triangle_2[2].x = 0.0;
                triangle_2[2].y = 0.0;
                pcVar23 = buf;
                for (lVar25 = 0; lVar25 != 3; lVar25 = lVar25 + 1) {
                  uVar1 = (uVar20 & 0xffffffff) + lVar25;
                  if (puVar22 == (unsigned_short *)0x0) {
                    uVar21 = (uint)uVar1;
                  }
                  else {
                    uVar21 = (uint)puVar22[(int)uVar20 + lVar25];
                  }
                  pIVar18 = ImVector<ImDrawVert>::operator[](this,uVar21);
                  triangle_2[lVar25] = pIVar18->pos;
                  pcVar19 = "     ";
                  if (lVar25 == 0) {
                    pcVar19 = "Vert:";
                  }
                  iVar15 = ImFormatString(pcVar23,(size_t)(local_3c + -(long)pcVar23),
                                          "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                          SUB84((double)(pIVar18->pos).x,0),(double)(pIVar18->pos).y
                                          ,(double)(pIVar18->uv).x,(double)(pIVar18->uv).y,pcVar19,
                                          uVar1 & 0xffffffff,(ulong)pIVar18->col);
                  pcVar23 = pcVar23 + iVar15;
                }
                local_1c0.x = 0.0;
                local_1c0.y = 0.0;
                Selectable(buf,false,0,&local_1c0);
                bVar12 = IsItemHovered(0);
                if (bVar12) {
                  uVar21 = (pIVar11->ForegroundDrawList).Flags;
                  (pIVar11->ForegroundDrawList).Flags = uVar21 & 0xfffffffe;
                  ImDrawList::AddPolyline(this_00,triangle_2,3,0xff00ffff,true,1.0);
                  (pIVar11->ForegroundDrawList).Flags = uVar21;
                }
                uVar20 = (uVar20 & 0xffffffff) + 3;
              }
            }
            TreePop();
            ImGuiListClipper::~ImGuiListClipper(&clipper);
          }
        }
      }
      else {
        BulletText("Callback %p, user_data %p",pIVar24->UserCallback,pIVar24->UserCallbackData);
      }
      local_1e0 = (ulong)(iVar14 + pIVar24->ElemCount);
      pIVar17 = (draw_list->CmdBuffer).Data;
    }
  }
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (show_drawcmd_details && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
                    for (unsigned int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255,0,255,255));
                    fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(255,255,0,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (fg_draw_list && ImGui::IsItemHovered() && show_drawcmd_details)
                {
                    // Draw wire-frame version of everything
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    ImRect clip_rect = pcmd->ClipRect;
                    fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255));
                    for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                    {
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++)
                            triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                        fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f);
                    }
                    fg_draw_list->Flags = backup_flags;
                }

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }